

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_MPEG2.cpp
# Opt level: O0

ostream * ASDCP::MPEG2::operator<<(ostream *strm,VideoDescriptor *VDesc)

{
  ostream *poVar1;
  void *pvVar2;
  VideoDescriptor *VDesc_local;
  ostream *strm_local;
  
  poVar1 = std::operator<<(strm,"        SampleRate: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(VDesc->SampleRate).Numerator);
  poVar1 = std::operator<<(poVar1,"/");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(VDesc->SampleRate).Denominator);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"       FrameLayout: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(uint)VDesc->FrameLayout);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"       StoredWidth: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,VDesc->StoredWidth);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"      StoredHeight: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,VDesc->StoredHeight);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"       AspectRatio: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(VDesc->AspectRatio).Numerator);
  poVar1 = std::operator<<(poVar1,"/");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(VDesc->AspectRatio).Denominator);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"    ComponentDepth: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,VDesc->ComponentDepth);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm," HorizontalSubsmpl: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,VDesc->HorizontalSubsampling);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"   VerticalSubsmpl: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,VDesc->VerticalSubsampling);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"       ColorSiting: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(uint)VDesc->ColorSiting);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"  CodedContentType: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(uint)VDesc->CodedContentType);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"          LowDelay: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(uint)(VDesc->LowDelay & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"           BitRate: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,VDesc->BitRate);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm,"   ProfileAndLevel: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(uint)VDesc->ProfileAndLevel);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(strm," ContainerDuration: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,VDesc->ContainerDuration);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return strm;
}

Assistant:

std::ostream&
ASDCP::MPEG2::operator << (std::ostream& strm, const VideoDescriptor& VDesc)
{
  strm << "        SampleRate: " << VDesc.SampleRate.Numerator << "/" << VDesc.SampleRate.Denominator << std::endl;
  strm << "       FrameLayout: " << (unsigned) VDesc.FrameLayout << std::endl;
  strm << "       StoredWidth: " << (unsigned) VDesc.StoredWidth << std::endl;
  strm << "      StoredHeight: " << (unsigned) VDesc.StoredHeight << std::endl;
  strm << "       AspectRatio: " << VDesc.AspectRatio.Numerator << "/" << VDesc.AspectRatio.Denominator << std::endl;
  strm << "    ComponentDepth: " << (unsigned) VDesc.ComponentDepth << std::endl;
  strm << " HorizontalSubsmpl: " << (unsigned) VDesc.HorizontalSubsampling << std::endl;
  strm << "   VerticalSubsmpl: " << (unsigned) VDesc.VerticalSubsampling << std::endl;
  strm << "       ColorSiting: " << (unsigned) VDesc.ColorSiting << std::endl;
  strm << "  CodedContentType: " << (unsigned) VDesc.CodedContentType << std::endl;
  strm << "          LowDelay: " << (unsigned) VDesc.LowDelay << std::endl;
  strm << "           BitRate: " << (unsigned) VDesc.BitRate << std::endl;
  strm << "   ProfileAndLevel: " << (unsigned) VDesc.ProfileAndLevel << std::endl;
  strm << " ContainerDuration: " << (unsigned) VDesc.ContainerDuration << std::endl;

  return strm;
}